

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O1

NOTE_DATA * new_note(void)

{
  NOTE_DATA *pNVar1;
  
  if (note_free == (NOTE_DATA *)0x0) {
    pNVar1 = (NOTE_DATA *)operator_new(0x40);
  }
  else {
    pNVar1 = note_free;
    note_free = note_free->next;
  }
  pNVar1->valid = true;
  return pNVar1;
}

Assistant:

NOTE_DATA *new_note()
{
	NOTE_DATA *note;

	if (note_free == nullptr)
	{
		note = new NOTE_DATA;
	}
	else
	{
		note = note_free;
		note_free = note_free->next;
	}

	note->valid = true;
	return note;
}